

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_explore_adf.cc
# Opt level: O0

void CB_EXPLORE_ADF::do_sort(cb_explore_adf *data)

{
  v_array<ACTION_SCORE::action_score> *in_RDI;
  anon_class_592_1_898a9ca8 *in_stack_00000240;
  action_score *in_stack_00000248;
  action_score *in_stack_00000250;
  cb_explore_adf *in_stack_fffffffffffffdb8;
  cb_explore_adf *in_stack_fffffffffffffdc0;
  
  v_array<ACTION_SCORE::action_score>::begin(in_RDI);
  v_array<ACTION_SCORE::action_score>::end(in_RDI);
  cb_explore_adf::cb_explore_adf(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
  std::
  sort<ACTION_SCORE::action_score*,CB_EXPLORE_ADF::do_sort(CB_EXPLORE_ADF::cb_explore_adf&)::__0>
            (in_stack_00000250,in_stack_00000248,in_stack_00000240);
  do_sort(CB_EXPLORE_ADF::cb_explore_adf&)::$_0::~__0((anon_class_592_1_898a9ca8 *)0x340340);
  return;
}

Assistant:

void do_sort(cb_explore_adf& data)
{
  // We want to preserve the score order in the returned action_probs if possible.  To do this,
  // sort top_actions and data.action_probs by the order induced in data.scores.
  sort(data.action_probs.begin(), data.action_probs.end(), [data](action_score as1, action_score as2) {
    if (as1.score > as2.score)
      return true;
    else if (as1.score < as2.score)
      return false;
    // equal probabilities
    if (data.scores[as1.action] < data.scores[as2.action])
      return true;
    else if (data.scores[as1.action] > data.scores[as2.action])
      return false;
    // equal probabilities and equal cost estimates
    return as1.action < as2.action;
  });
}